

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O3

void __thiscall
crawler::Node::Node(Node *this,string *_name,AttrMap *_attrMap,
                   vector<crawler::Node,_std::allocator<crawler::Node>_> *_children,
                   shared_ptr<crawler::Node> *_parent)

{
  undefined1 *puVar1;
  pointer pcVar2;
  pointer pNVar3;
  _Base_ptr p_Var4;
  size_t *psVar5;
  pointer local_d8;
  pointer local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [72];
  size_t local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x10) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x18) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x20) = 0;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x28) = 0;
  *(undefined1 **)
   &(this->nodeData).
    super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>._M_u =
       (undefined1 *)
       ((long)&(this->nodeData).
               super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
               super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
       + 0x10);
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> + 8
   ) = 0;
  puVar1 = (undefined1 *)
           ((long)&(this->nodeData).
                   super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
                   .super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
                   super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
                   super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>
           + 0x28);
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x30) = 0;
  *(undefined1 **)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x38) = puVar1;
  *(undefined1 **)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x40) = puVar1;
  *(undefined8 *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x48) = 0;
  *(__index_type *)
   ((long)&(this->nodeData).
           super__Variant_base<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super__Move_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_assign_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Move_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Copy_ctor_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_>.
           super__Variant_storage_alias<crawler::ElementData,_std::__cxx11::basic_string<char>_> +
   0x50) = '\0';
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pNVar3 = (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar3;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8._16_8_ = (pointer)0x0;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (_children->super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_b8);
  (this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_parent->super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  pcVar2 = (_name->_M_dataplus)._M_p;
  local_d8 = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + _name->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_60,&_attrMap->_M_t);
  if (local_d8 == (pointer)&local_c8) {
    local_b8._24_8_ = local_c8._8_8_;
    local_b8._0_8_ = (pointer)((long)local_b8 + 0x10U);
  }
  else {
    local_b8._0_8_ = local_d8;
  }
  local_b8._17_7_ = local_c8._M_allocated_capacity._1_7_;
  local_b8[0x10] = local_c8._M_local_buf[0];
  local_b8._56_8_ = (long)local_b8 + 0x28;
  local_b8._8_8_ = local_d0;
  local_d0 = (pointer)0x0;
  local_c8._M_local_buf[0] = '\0';
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    psVar5 = local_70;
    local_b8._48_8_ = (_Base_ptr)0x0;
    local_b8._40_4_ = Element;
    local_b8._64_8_ = local_b8._56_8_;
  }
  else {
    p_Var4 = (_Base_ptr)((long)&local_60._M_impl + 8);
    local_b8._48_8_ = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(undefined8 *)((long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent + 8) =
         local_b8._56_8_;
    psVar5 = (size_t *)((long)&local_60 + 0x28);
    local_70[0] = local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b8._56_8_ = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b8._64_8_ = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    local_b8._40_4_ = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = p_Var4;
  }
  *psVar5 = 0;
  local_d8 = (pointer)&local_c8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_d8 != (pointer)&local_c8) {
    operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                             + 1);
  }
  this->nodeType = Element;
  std::variant<crawler::ElementData,std::__cxx11::string>::operator=
            ((variant<crawler::ElementData,std::__cxx11::string> *)&this->nodeData,
             (ElementData *)local_b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)local_b8 + 0x20));
  if ((pointer)local_b8._0_8_ != (pointer)((long)local_b8 + 0x10U)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  return;
}

Assistant:

explicit Node(const std::string &_name, const AttrMap &_attrMap,
                std::vector<Node> _children,
                const std::shared_ptr<Node> &_parent) {
    children = std::move(_children);
    parent = _parent;
    ElementData elementData(_name, _attrMap);
    nodeType = NodeType::Element;
    nodeData = elementData;
  }